

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::GradientFillRectDecal
          (PixelGameEngine *this,vf2d *pos,vf2d *size,Pixel colTL,Pixel colBL,Pixel colBR,
          Pixel colTR)

{
  array<olc::v2d_generic<float>,_4UL> points;
  anon_union_4_2_12391da5_for_Pixel_0 local_58;
  anon_union_4_2_12391da5_for_Pixel_0 local_54;
  anon_union_4_2_12391da5_for_Pixel_0 local_50;
  anon_union_4_2_12391da5_for_Pixel_0 local_4c;
  vf2d local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  vf2d local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_28.x = pos->x;
  local_28.y = pos->y;
  local_1c = size->y + local_28.y;
  local_18 = local_28.x + size->x;
  local_38 = 0;
  uStack_30 = 0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  local_4c = colTR.field_0;
  local_58 = colTL.field_0;
  local_54 = colBL.field_0;
  local_50 = colBR.field_0;
  local_20 = local_28.x;
  local_14 = local_1c;
  local_10 = local_18;
  local_c = local_28.y;
  DrawExplicitDecal(this,(Decal *)0x0,&local_28,&local_48,(Pixel *)&local_58.field_1);
  return;
}

Assistant:

void PixelGameEngine::GradientFillRectDecal(const olc::vf2d& pos, const olc::vf2d& size, const olc::Pixel colTL, const olc::Pixel colBL, const olc::Pixel colBR, const olc::Pixel colTR)
	{
		std::array<olc::vf2d, 4> points = { { {pos}, {pos.x, pos.y + size.y}, {pos + size}, {pos.x + size.x, pos.y} } };
		std::array<olc::vf2d, 4> uvs = { {{0,0},{0,0},{0,0},{0,0}} };
		std::array<olc::Pixel, 4> cols = { {colTL, colBL, colBR, colTR} };
		DrawExplicitDecal(nullptr, points.data(), uvs.data(), cols.data());
	}